

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_file.cc
# Opt level: O1

int by_file_ctrl(X509_LOOKUP *ctx,int cmd,char *argp,long argl,char **ret)

{
  int iVar1;
  char *__name;
  uint uVar2;
  
  uVar2 = 0;
  if (cmd == 1) {
    iVar1 = (int)argl;
    if (argl == 3) {
      __name = X509_get_default_cert_file_env();
      argp = getenv(__name);
      iVar1 = 1;
      if (argp == (char *)0x0) {
        argp = X509_get_default_cert_file();
      }
    }
    iVar1 = X509_load_cert_crl_file((X509_LOOKUP *)ctx,argp,iVar1);
    if (argl == 3 && iVar1 == 0) {
      uVar2 = 0;
      ERR_put_error(0xb,0,0x76,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                    ,0x34);
    }
    else {
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  return uVar2;
}

Assistant:

static int by_file_ctrl(X509_LOOKUP *ctx, int cmd, const char *argp, long argl,
                        char **ret) {
  if (cmd != X509_L_FILE_LOAD) {
    return 0;
  }
  const char *file = argp;
  int type = argl;
  if (argl == X509_FILETYPE_DEFAULT) {
    if ((file = getenv(X509_get_default_cert_file_env())) == NULL) {
      file = X509_get_default_cert_file();
    }
    type = X509_FILETYPE_PEM;
  }
  if (X509_load_cert_crl_file(ctx, file, type) != 0) {
    return 1;
  }
  if (argl == X509_FILETYPE_DEFAULT) {
    OPENSSL_PUT_ERROR(X509, X509_R_LOADING_DEFAULTS);
  }
  return 0;
}